

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::HasFixedFunctionAddressTarget(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  AddrOpndKind AVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  AddrOpnd *pAVar6;
  bool local_19;
  Instr *this_local;
  
  if ((((this->m_opcode != CallI) && (this->m_opcode != CallIFixed)) &&
      (this->m_opcode != NewScObject)) &&
     (((this->m_opcode != NewScObjectSpread && (this->m_opcode != NewScObjArray)) &&
      ((this->m_opcode != NewScObjArraySpread && (this->m_opcode != NewScObjectNoCtor)))))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd60,
                       "(this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed || this->m_opcode == Js::OpCode::NewScObject || this->m_opcode == Js::OpCode::NewScObjectSpread || this->m_opcode == Js::OpCode::NewScObjArray || this->m_opcode == Js::OpCode::NewScObjArraySpread || this->m_opcode == Js::OpCode::NewScObjectNoCtor)"
                       ,
                       "this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed || this->m_opcode == Js::OpCode::NewScObject || this->m_opcode == Js::OpCode::NewScObjectSpread || this->m_opcode == Js::OpCode::NewScObjArray || this->m_opcode == Js::OpCode::NewScObjArraySpread || this->m_opcode == Js::OpCode::NewScObjectNoCtor"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = GetSrc1(this);
  local_19 = false;
  if (pOVar5 != (Opnd *)0x0) {
    pOVar5 = GetSrc1(this);
    bVar2 = Opnd::IsAddrOpnd(pOVar5);
    local_19 = false;
    if (bVar2) {
      pOVar5 = GetSrc1(this);
      pAVar6 = Opnd::AsAddrOpnd(pOVar5);
      AVar3 = AddrOpnd::GetAddrOpndKind(pAVar6);
      local_19 = false;
      if (AVar3 == AddrOpndKindDynamicVar) {
        pOVar5 = GetSrc1(this);
        pAVar6 = Opnd::AsAddrOpnd(pOVar5);
        local_19 = (bool)((byte)pAVar6->field_0x28 >> 1 & 1);
      }
    }
  }
  return local_19;
}

Assistant:

bool Instr::HasFixedFunctionAddressTarget() const
{
    Assert(
        this->m_opcode == Js::OpCode::CallI ||
        this->m_opcode == Js::OpCode::CallIFixed ||
        this->m_opcode == Js::OpCode::NewScObject ||
        this->m_opcode == Js::OpCode::NewScObjectSpread ||
        this->m_opcode == Js::OpCode::NewScObjArray ||
        this->m_opcode == Js::OpCode::NewScObjArraySpread ||
        this->m_opcode == Js::OpCode::NewScObjectNoCtor);
    return
        this->GetSrc1() != nullptr &&
        this->GetSrc1()->IsAddrOpnd() &&
        this->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKind::AddrOpndKindDynamicVar &&
        this->GetSrc1()->AsAddrOpnd()->m_isFunction;
}